

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  mat44 R;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  nifti_image *pnVar4;
  nifti_image *pnVar5;
  nifti_image *nim;
  long lVar6;
  char *pcVar7;
  long lVar8;
  undefined **ppuVar9;
  float (*message) [4];
  bool bVar10;
  float fVar11;
  int Errors;
  float qfac;
  float dz;
  float dy;
  float dx;
  float qz;
  float qy;
  float qx;
  nifti_brick_list NB_orig;
  int blist [5];
  char write_image_filename [6] [64];
  nifti_brick_list NB_select;
  char TEMP_STR [256];
  uint local_760;
  float local_75c;
  float local_758;
  float local_754;
  long local_750;
  float local_748;
  float local_744;
  float local_740;
  float local_73c;
  mat44 local_738 [8];
  float local_538 [8];
  znzFile local_518 [8];
  char local_4d8 [128];
  char local_458 [64];
  char local_418 [128];
  nifti_1_header local_398;
  char local_238 [520];
  
  nifti_set_debug_level(3);
  local_760 = 0;
  printf("%s%s (LINE %d): %s\n","==========ERROR","",0xa5,
         "NOT REALLY AN ERROR, JUST TESTING THE ERROR TEST REPORTING MECHANISM");
  fflush(_stdout);
  bVar10 = local_760 == 0;
  local_760 = local_760 + 1;
  _PrintTest(0xa6,"NOT REALLY AN ERROR, JUST TESTING THE ERROR COUNTING MECHANISM",(uint)bVar10,
             NIFTITEST_FALSE,(int *)&local_760);
  local_760 = 0;
  memcpy(local_518,"ATestReferenceImageForReadingAndWriting.nii",0x180);
  puts("======= Testing All Nifti Valid Names ======");
  fflush(_stdout);
  lVar6 = 0;
  do {
    pcVar7 = (char *)((long)local_518 + lVar6);
    local_750 = lVar6;
    pcVar3 = strstr(pcVar7,".img.gz");
    bVar10 = true;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr(pcVar7,".hdr.gz");
      bVar10 = pcVar3 != (char *)0x0;
    }
    printf("======= Testing with filename: %s ======\n",pcVar7);
    fflush(_stdout);
    pnVar4 = generate_reference_image(pcVar7,(int *)&local_760);
    sprintf(local_238,"nifti_add_extension %s",pcVar7);
    iVar1 = nifti_add_extension(pnVar4,main::ext,0xf,6);
    _PrintTest(200,local_238,(uint)(iVar1 == -1),NIFTITEST_FALSE,(int *)&local_760);
    sprintf(local_238,"valid_nifti_extension %s",pcVar7);
    iVar1 = valid_nifti_extensions(pnVar4);
    _PrintTest(0xcc,"valid_nifti_extensions",(uint)(iVar1 == 0),NIFTITEST_FALSE,(int *)&local_760);
    _PrintTest(0xce,"Create reference image",(uint)(pnVar4 == (nifti_image *)0x0),NIFTITEST_TRUE,
               (int *)&local_760);
    nifti_image_write(pnVar4);
    pnVar5 = nifti_simple_init_nim();
    iVar1 = nifti_copy_extensions(pnVar5,pnVar4);
    _PrintTest(0xd7,"nifti_copy_extension",iVar1,NIFTITEST_FALSE,(int *)&local_760);
    nifti_image_free(pnVar5);
    pnVar5 = nifti_copy_nim_info(pnVar4);
    _PrintTest(0xdd,"nifti_copy_nim_info",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
               (int *)&local_760);
    iVar1 = nifti_nim_is_valid(pnVar5,0);
    _PrintTest(0xe0,"nifti_nim_is_valid",(uint)(iVar1 == 0),NIFTITEST_FALSE,(int *)&local_760);
    nifti_image_free(pnVar5);
    pnVar5 = nifti_image_read(pnVar4->fname,1);
    _PrintTest(0xe8,"Reload of image ",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_TRUE,
               (int *)&local_760);
    iVar1 = valid_nifti_extensions(pnVar5);
    sprintf(local_238,"reload valid_nifti_extensions %s",pcVar7);
    _PrintTest(0xf5,local_238,(uint)(byte)(iVar1 == 0 ^ bVar10),NIFTITEST_FALSE,(int *)&local_760);
    nifti_image_infodump(pnVar5);
    compare_reference_image_values(pnVar4,pnVar5,(int *)&local_760);
    nifti_image_free(pnVar5);
    local_538[0] = 9.80909e-45;
    local_538[1] = 0.0;
    local_538[2] = 7.00649e-45;
    local_538[3] = 7.00649e-45;
    local_538[4] = 1.26117e-44;
    pnVar5 = nifti_image_read_bricks(pnVar4->fname,0,(int *)local_538,(nifti_brick_list *)local_738)
    ;
    _PrintTest(0x107,"invalid arg bricked image read 1",(uint)(pnVar5 != (nifti_image *)0x0),
               NIFTITEST_FALSE,(int *)&local_760);
    pnVar5 = nifti_image_read_bricks(pnVar4->fname,0,(int *)0x0,(nifti_brick_list *)local_738);
    _PrintTest(0x10a,"Reload of bricked image",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
               (int *)&local_760);
    nifti_free_NBL((nifti_brick_list *)local_738);
    nifti_image_free(pnVar5);
    nim = nifti_image_read_bricks(pnVar4->fname,5,(int *)local_538,(nifti_brick_list *)&local_398);
    _PrintTest(0x10f,"Reload of bricked image with blist",(uint)(pnVar5 == (nifti_image *)0x0),
               NIFTITEST_FALSE,(int *)&local_760);
    nifti_free_NBL((nifti_brick_list *)&local_398);
    nifti_image_free(nim);
    iVar1 = nifti_update_dims_from_array(pnVar4);
    _PrintTest(0x119,"nifti_update_dims_from_array -- valid dims",(uint)(iVar1 != 0),NIFTITEST_FALSE
               ,(int *)&local_760);
    pnVar4->dim[0] = 8;
    iVar1 = nifti_update_dims_from_array(pnVar4);
    _PrintTest(0x11d,"nifti_update_dims_from_array -- invalid dims",(uint)(iVar1 == 0),
               NIFTITEST_FALSE,(int *)&local_760);
    nifti_convert_nim2nhdr(&local_398,pnVar4);
    sprintf((char *)local_738,"nifti_hdr_looks_good %s",pnVar4->fname);
    iVar1 = nifti_hdr_looks_good(&local_398);
    _PrintTest(0x124,(char *)local_738,(uint)(iVar1 == 0),NIFTITEST_FALSE,(int *)&local_760);
    nifti_image_free(pnVar4);
    lVar6 = local_750 + 0x40;
  } while (lVar6 != 0x180);
  pcVar3 = nifti_findimgname("ATestReferenceImageForReadingAndWriting.hdr",2);
  if (pcVar3 == (char *)0x0) {
    uVar2 = 1;
  }
  else {
    iVar1 = strcmp(pcVar3,"ATestReferenceImageForReadingAndWriting.img");
    uVar2 = (uint)(iVar1 != 0);
  }
  _PrintTest(0x131,"nifti_findimgname",uVar2,NIFTITEST_FALSE,(int *)&local_760);
  free(pcVar3);
  iVar1 = is_nifti_file((char *)local_518);
  _PrintTest(0x138,"is_nifti_file0",(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  iVar1 = is_nifti_file(local_4d8);
  _PrintTest(0x13b,"is_nifti_file1",(uint)(iVar1 != 2),NIFTITEST_FALSE,(int *)&local_760);
  iVar1 = is_nifti_file(local_458);
  _PrintTest(0x13e,"is_nifti_file2",(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  iVar1 = is_nifti_file(local_418);
  _PrintTest(0x141,"is_nifti_file2",(uint)(iVar1 != 2),NIFTITEST_FALSE,(int *)&local_760);
  pnVar4 = generate_reference_image("TestAsciiImage.nia",(int *)&local_760);
  pnVar4->nifti_type = 3;
  nifti_image_write(pnVar4);
  pnVar5 = nifti_image_read("TestAsciiImage.nia",1);
  _PrintTest(0x14f,"Read/Write Ascii image",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_760);
  nifti_image_free(pnVar4);
  nifti_image_free(pnVar5);
  ppuVar9 = &PTR_anon_var_dwarf_38df_00123900;
  lVar6 = 0;
  do {
    pcVar3 = *ppuVar9;
    printf("\nTesting \"%s\" filename\n",pcVar3);
    uVar2 = nifti_validfilename(pcVar3);
    snprintf(local_238,0x100,"nifti_validfilename(\"%s\")=%d",pcVar3,(ulong)uVar2);
    _PrintTest(0x185,local_238,(uint)(uVar2 != *(uint *)((long)&DAT_00117e10 + lVar6)),
               NIFTITEST_FALSE,(int *)&local_760);
    uVar2 = nifti_is_complete_filename(pcVar3);
    snprintf(local_238,0x100,"nifti_is_complete_filename(\"%s\")=%d",pcVar3,(ulong)uVar2);
    _PrintTest(0x18a,local_238,(uint)(uVar2 != *(uint *)((long)&DAT_00117e30 + lVar6)),
               NIFTITEST_FALSE,(int *)&local_760);
    pcVar7 = nifti_makebasename(pcVar3);
    snprintf(local_238,0x100,"nifti_makebasename(\"%s\")=\"%s\"",pcVar3,pcVar7);
    iVar1 = strcmp(pcVar7,(char *)((long)&DAT_00117de4 + (long)*(int *)((long)&DAT_00117de4 + lVar6)
                                  ));
    _PrintTest(400,local_238,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
    free(pcVar7);
    lVar6 = lVar6 + 4;
    ppuVar9 = ppuVar9 + 1;
  } while (lVar6 != 0x20);
  nifti_disp_lib_hist();
  nifti_disp_lib_version();
  lVar6 = 0;
  pnVar4 = nifti_image_read_bricks((char *)0x0,-1,(int *)0x0,(nifti_brick_list *)0x0);
  _PrintTest(0x1a2,"nifti_image_read_bricks 1",(uint)(pnVar4 != (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_760);
  pnVar4 = nifti_image_read_bricks("NOFILE.NOFILE",-1,(int *)0x0,(nifti_brick_list *)0x0);
  _PrintTest(0x1a7,"nifti_image_read_bricks 1",(uint)(pnVar4 != (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","UNKNOWN");
  pcVar3 = nifti_datatype_string(0);
  iVar1 = strcmp(pcVar3,"UNKNOWN");
  _PrintTest(0x1b6,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","BINARY");
  pcVar3 = nifti_datatype_string(1);
  iVar1 = strcmp(pcVar3,"BINARY");
  _PrintTest(0x1b7,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT8");
  pcVar3 = nifti_datatype_string(0x100);
  iVar1 = strcmp(pcVar3,"INT8");
  _PrintTest(0x1b8,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT8");
  pcVar3 = nifti_datatype_string(2);
  iVar1 = strcmp(pcVar3,"UINT8");
  _PrintTest(0x1b9,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT16");
  pcVar3 = nifti_datatype_string(4);
  iVar1 = strcmp(pcVar3,"INT16");
  _PrintTest(0x1ba,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT16");
  pcVar3 = nifti_datatype_string(0x200);
  iVar1 = strcmp(pcVar3,"UINT16");
  _PrintTest(0x1bb,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT32");
  pcVar3 = nifti_datatype_string(8);
  iVar1 = strcmp(pcVar3,"INT32");
  _PrintTest(0x1bc,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT32");
  pcVar3 = nifti_datatype_string(0x300);
  iVar1 = strcmp(pcVar3,"UINT32");
  _PrintTest(0x1bd,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT64");
  pcVar3 = nifti_datatype_string(0x400);
  iVar1 = strcmp(pcVar3,"INT64");
  _PrintTest(0x1be,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT64");
  pcVar3 = nifti_datatype_string(0x500);
  iVar1 = strcmp(pcVar3,"UINT64");
  _PrintTest(0x1bf,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","FLOAT32");
  pcVar3 = nifti_datatype_string(0x10);
  iVar1 = strcmp(pcVar3,"FLOAT32");
  _PrintTest(0x1c0,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","FLOAT64");
  pcVar3 = nifti_datatype_string(0x40);
  iVar1 = strcmp(pcVar3,"FLOAT64");
  _PrintTest(0x1c1,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","FLOAT128");
  pcVar3 = nifti_datatype_string(0x600);
  iVar1 = strcmp(pcVar3,"FLOAT128");
  _PrintTest(0x1c2,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","COMPLEX64");
  pcVar3 = nifti_datatype_string(0x20);
  iVar1 = strcmp(pcVar3,"COMPLEX64");
  _PrintTest(0x1c3,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","COMPLEX128");
  pcVar3 = nifti_datatype_string(0x700);
  iVar1 = strcmp(pcVar3,"COMPLEX128");
  _PrintTest(0x1c4,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","COMPLEX256");
  pcVar3 = nifti_datatype_string(0x800);
  iVar1 = strcmp(pcVar3,"COMPLEX256");
  _PrintTest(0x1c5,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %s","RGB24");
  pcVar3 = nifti_datatype_string(0x80);
  iVar1 = strcmp(pcVar3,"RGB24");
  _PrintTest(0x1c6,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0);
  iVar1 = nifti_is_inttype(0);
  _PrintTest(0x1d1,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",1);
  iVar1 = nifti_is_inttype(1);
  _PrintTest(0x1d2,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x100);
  iVar1 = nifti_is_inttype(0x100);
  _PrintTest(0x1d3,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",2);
  iVar1 = nifti_is_inttype(2);
  _PrintTest(0x1d4,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",4);
  iVar1 = nifti_is_inttype(4);
  _PrintTest(0x1d5,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x200);
  iVar1 = nifti_is_inttype(0x200);
  _PrintTest(0x1d6,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",8);
  iVar1 = nifti_is_inttype(8);
  _PrintTest(0x1d7,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x300);
  iVar1 = nifti_is_inttype(0x300);
  _PrintTest(0x1d8,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x400);
  iVar1 = nifti_is_inttype(0x400);
  _PrintTest(0x1d9,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x500);
  iVar1 = nifti_is_inttype(0x500);
  _PrintTest(0x1da,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x10);
  iVar1 = nifti_is_inttype(0x10);
  _PrintTest(0x1db,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x40);
  iVar1 = nifti_is_inttype(0x40);
  _PrintTest(0x1dc,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x600);
  iVar1 = nifti_is_inttype(0x600);
  _PrintTest(0x1dd,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x20);
  iVar1 = nifti_is_inttype(0x20);
  _PrintTest(0x1de,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x700);
  iVar1 = nifti_is_inttype(0x700);
  _PrintTest(0x1df,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x800);
  iVar1 = nifti_is_inttype(0x800);
  _PrintTest(0x1e0,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x80);
  iVar1 = nifti_is_inttype(0x80);
  _PrintTest(0x1e1,(char *)local_738,(uint)(iVar1 != 1),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","m");
  pcVar3 = nifti_units_string(1);
  iVar1 = strcmp(pcVar3,"m");
  _PrintTest(0x1ec,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","mm");
  pcVar3 = nifti_units_string(2);
  iVar1 = strcmp(pcVar3,"mm");
  _PrintTest(0x1ed,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","um");
  pcVar3 = nifti_units_string(3);
  iVar1 = strcmp(pcVar3,"um");
  _PrintTest(0x1ee,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","s");
  pcVar3 = nifti_units_string(8);
  iVar1 = strcmp(pcVar3,"s");
  _PrintTest(0x1ef,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","ms");
  pcVar3 = nifti_units_string(0x10);
  iVar1 = strcmp(pcVar3,"ms");
  _PrintTest(0x1f0,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","us");
  pcVar3 = nifti_units_string(0x18);
  iVar1 = strcmp(pcVar3,"us");
  _PrintTest(0x1f1,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","Hz");
  pcVar3 = nifti_units_string(0x20);
  iVar1 = strcmp(pcVar3,"Hz");
  _PrintTest(0x1f2,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","ppm");
  pcVar3 = nifti_units_string(0x28);
  iVar1 = strcmp(pcVar3,"ppm");
  _PrintTest(499,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_units_string_test %s","rad/s");
  pcVar3 = nifti_units_string(0x30);
  iVar1 = strcmp(pcVar3,"rad/s");
  _PrintTest(500,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Correlation statistic");
  pcVar3 = nifti_intent_string(2);
  iVar1 = strcmp(pcVar3,"Correlation statistic");
  _PrintTest(0x1ff,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","T-statistic");
  pcVar3 = nifti_intent_string(3);
  iVar1 = strcmp(pcVar3,"T-statistic");
  _PrintTest(0x200,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","F-statistic");
  pcVar3 = nifti_intent_string(4);
  iVar1 = strcmp(pcVar3,"F-statistic");
  _PrintTest(0x201,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Z-score");
  pcVar3 = nifti_intent_string(5);
  iVar1 = strcmp(pcVar3,"Z-score");
  _PrintTest(0x202,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Chi-squared distribution");
  pcVar3 = nifti_intent_string(6);
  iVar1 = strcmp(pcVar3,"Chi-squared distribution");
  _PrintTest(0x203,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Beta distribution");
  pcVar3 = nifti_intent_string(7);
  iVar1 = strcmp(pcVar3,"Beta distribution");
  _PrintTest(0x204,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Binomial distribution");
  pcVar3 = nifti_intent_string(8);
  iVar1 = strcmp(pcVar3,"Binomial distribution");
  _PrintTest(0x205,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Gamma distribution");
  pcVar3 = nifti_intent_string(9);
  iVar1 = strcmp(pcVar3,"Gamma distribution");
  _PrintTest(0x206,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Poisson distribution");
  pcVar3 = nifti_intent_string(10);
  iVar1 = strcmp(pcVar3,"Poisson distribution");
  _PrintTest(0x207,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Normal distribution");
  pcVar3 = nifti_intent_string(0xb);
  iVar1 = strcmp(pcVar3,"Normal distribution");
  _PrintTest(0x208,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","F-statistic noncentral");
  pcVar3 = nifti_intent_string(0xc);
  iVar1 = strcmp(pcVar3,"F-statistic noncentral");
  _PrintTest(0x209,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Chi-squared noncentral");
  pcVar3 = nifti_intent_string(0xd);
  iVar1 = strcmp(pcVar3,"Chi-squared noncentral");
  _PrintTest(0x20a,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Logistic distribution");
  pcVar3 = nifti_intent_string(0xe);
  iVar1 = strcmp(pcVar3,"Logistic distribution");
  _PrintTest(0x20b,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Laplace distribution");
  pcVar3 = nifti_intent_string(0xf);
  iVar1 = strcmp(pcVar3,"Laplace distribution");
  _PrintTest(0x20c,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Uniform distribition");
  pcVar3 = nifti_intent_string(0x10);
  iVar1 = strcmp(pcVar3,"Uniform distribition");
  _PrintTest(0x20d,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","T-statistic noncentral");
  pcVar3 = nifti_intent_string(0x11);
  iVar1 = strcmp(pcVar3,"T-statistic noncentral");
  _PrintTest(0x20e,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Weibull distribution");
  pcVar3 = nifti_intent_string(0x12);
  iVar1 = strcmp(pcVar3,"Weibull distribution");
  _PrintTest(0x20f,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Chi distribution");
  pcVar3 = nifti_intent_string(0x13);
  iVar1 = strcmp(pcVar3,"Chi distribution");
  _PrintTest(0x210,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Inverse Gaussian distribution");
  pcVar3 = nifti_intent_string(0x14);
  iVar1 = strcmp(pcVar3,"Inverse Gaussian distribution");
  _PrintTest(0x211,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Extreme Value distribution");
  pcVar3 = nifti_intent_string(0x15);
  iVar1 = strcmp(pcVar3,"Extreme Value distribution");
  _PrintTest(0x212,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","P-value");
  pcVar3 = nifti_intent_string(0x16);
  iVar1 = strcmp(pcVar3,"P-value");
  _PrintTest(0x213,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Log P-value");
  pcVar3 = nifti_intent_string(0x17);
  iVar1 = strcmp(pcVar3,"Log P-value");
  _PrintTest(0x214,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Log10 P-value");
  pcVar3 = nifti_intent_string(0x18);
  iVar1 = strcmp(pcVar3,"Log10 P-value");
  _PrintTest(0x215,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Estimate");
  pcVar3 = nifti_intent_string(0x3e9);
  iVar1 = strcmp(pcVar3,"Estimate");
  _PrintTest(0x216,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Label index");
  pcVar3 = nifti_intent_string(0x3ea);
  iVar1 = strcmp(pcVar3,"Label index");
  _PrintTest(0x217,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","NeuroNames index");
  pcVar3 = nifti_intent_string(0x3eb);
  iVar1 = strcmp(pcVar3,"NeuroNames index");
  _PrintTest(0x218,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","General matrix");
  pcVar3 = nifti_intent_string(0x3ec);
  iVar1 = strcmp(pcVar3,"General matrix");
  _PrintTest(0x219,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Symmetric matrix");
  pcVar3 = nifti_intent_string(0x3ed);
  iVar1 = strcmp(pcVar3,"Symmetric matrix");
  _PrintTest(0x21a,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Displacement vector");
  pcVar3 = nifti_intent_string(0x3ee);
  iVar1 = strcmp(pcVar3,"Displacement vector");
  _PrintTest(0x21b,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Vector");
  pcVar3 = nifti_intent_string(0x3ef);
  iVar1 = strcmp(pcVar3,"Vector");
  _PrintTest(0x21c,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Pointset");
  pcVar3 = nifti_intent_string(0x3f0);
  iVar1 = strcmp(pcVar3,"Pointset");
  _PrintTest(0x21d,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Triangle");
  pcVar3 = nifti_intent_string(0x3f1);
  iVar1 = strcmp(pcVar3,"Triangle");
  _PrintTest(0x21e,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Quaternion");
  pcVar3 = nifti_intent_string(0x3f2);
  iVar1 = strcmp(pcVar3,"Quaternion");
  _PrintTest(0x21f,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Dimensionless number");
  pcVar3 = nifti_intent_string(0x3f3);
  iVar1 = strcmp(pcVar3,"Dimensionless number");
  _PrintTest(0x220,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_intent_string %s","Unknown");
  pcVar3 = nifti_intent_string(-200);
  iVar1 = strcmp(pcVar3,"Unknown");
  _PrintTest(0x221,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_slice_string_test %s","sequential_increasing");
  pcVar3 = nifti_slice_string(1);
  iVar1 = strcmp(pcVar3,"sequential_increasing");
  _PrintTest(0x22d,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_slice_string_test %s","sequential_decreasing");
  pcVar3 = nifti_slice_string(2);
  iVar1 = strcmp(pcVar3,"sequential_decreasing");
  _PrintTest(0x22e,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_increasing");
  pcVar3 = nifti_slice_string(3);
  iVar1 = strcmp(pcVar3,"alternating_increasing");
  _PrintTest(0x22f,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_decreasing");
  pcVar3 = nifti_slice_string(4);
  iVar1 = strcmp(pcVar3,"alternating_decreasing");
  _PrintTest(0x230,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_increasing_2");
  pcVar3 = nifti_slice_string(5);
  iVar1 = strcmp(pcVar3,"alternating_increasing_2");
  _PrintTest(0x231,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_decreasing_2");
  pcVar3 = nifti_slice_string(6);
  iVar1 = strcmp(pcVar3,"alternating_decreasing_2");
  _PrintTest(0x232,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Left-to-Right");
  pcVar3 = nifti_orientation_string(1);
  iVar1 = strcmp(pcVar3,"Left-to-Right");
  _PrintTest(0x23d,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Right-to-Left");
  pcVar3 = nifti_orientation_string(2);
  iVar1 = strcmp(pcVar3,"Right-to-Left");
  _PrintTest(0x23e,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Posterior-to-Anterior");
  pcVar3 = nifti_orientation_string(3);
  iVar1 = strcmp(pcVar3,"Posterior-to-Anterior");
  _PrintTest(0x23f,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Anterior-to-Posterior");
  pcVar3 = nifti_orientation_string(4);
  iVar1 = strcmp(pcVar3,"Anterior-to-Posterior");
  _PrintTest(0x240,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Inferior-to-Superior");
  pcVar3 = nifti_orientation_string(5);
  iVar1 = strcmp(pcVar3,"Inferior-to-Superior");
  _PrintTest(0x241,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Superior-to-Inferior");
  pcVar3 = nifti_orientation_string(6);
  iVar1 = strcmp(pcVar3,"Superior-to-Inferior");
  _PrintTest(0x242,(char *)local_738,(uint)(iVar1 != 0),NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",2);
  nifti_datatype_sizes(2,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x252,(char *)local_738,
             (uint)(local_518[0]._0_4_ != 1.4013e-45 || (float)local_398.sizeof_hdr != 0.0),
             NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x200);
  nifti_datatype_sizes(0x200,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x253,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 2.8026e-45 || local_518[0]._0_4_ != 2.8026e-45),
             NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x80);
  nifti_datatype_sizes(0x80,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x254,(char *)local_738,
             (uint)(local_518[0]._0_4_ != 4.2039e-45 || (float)local_398.sizeof_hdr != 0.0),
             NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x10);
  nifti_datatype_sizes(0x10,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x255,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 5.60519e-45 || local_518[0]._0_4_ != 5.60519e-45)
             ,NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x20);
  nifti_datatype_sizes(0x20,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x256,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 5.60519e-45 || local_518[0]._0_4_ != 1.12104e-44)
             ,NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x500);
  nifti_datatype_sizes(0x500,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(599,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 1.12104e-44 || local_518[0]._0_4_ != 1.12104e-44)
             ,NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x600);
  nifti_datatype_sizes(0x600,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(600,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 2.24208e-44 || local_518[0]._0_4_ != 2.24208e-44)
             ,NIFTITEST_FALSE,(int *)&local_760);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x700);
  nifti_datatype_sizes(0x700,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x259,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 1.12104e-44 || local_518[0]._0_4_ != 2.24208e-44)
             ,NIFTITEST_FALSE,(int *)&local_760);
  message = (float (*) [4])local_738;
  sprintf((char *)message,"nifti_datatype_sizes_test %d",0x800);
  nifti_datatype_sizes(0x800,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x25a,(char *)message,
             (uint)((float)local_398.sizeof_hdr != 2.24208e-44 || local_518[0]._0_4_ != 4.48416e-44)
             ,NIFTITEST_FALSE,(int *)&local_760);
  do {
    lVar8 = 0;
    do {
      fVar11 = 1.0;
      if (lVar6 != lVar8) {
        fVar11 = 0.0;
      }
      (*(float (*) [4])*message)[lVar8] = fVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar6 = lVar6 + 1;
    message = message + 1;
  } while (lVar6 != 4);
  R.m[1][1] = local_738[0].m[1][1];
  R.m[1][0] = local_738[0].m[1][0];
  R.m[2][3] = local_738[0].m[2][3];
  R.m[2][2] = local_738[0].m[2][2];
  R.m[3][3] = local_738[0].m[3][3];
  R.m[3][2] = local_738[0].m[3][2];
  R.m[0][2] = local_738[0].m[0][2];
  R.m[0][3] = local_738[0].m[0][3];
  R.m[0][0] = local_738[0].m[0][0];
  R.m[0][1] = local_738[0].m[0][1];
  R.m[1][2] = local_738[0].m[1][2];
  R.m[1][3] = local_738[0].m[1][3];
  R.m[2][0] = local_738[0].m[2][0];
  R.m[2][1] = local_738[0].m[2][1];
  R.m[3][0] = local_738[0].m[3][0];
  R.m[3][1] = local_738[0].m[3][1];
  nifti_mat44_to_quatern
            (R,(float *)local_518,(float *)&local_398,local_538,&local_73c,&local_740,&local_744,
             &local_748,&local_754,&local_758,&local_75c);
  _PrintTest(0x272,"nifti_mat44_to_quatern",
             (byte)((local_75c != 1.0 ||
                    (local_758 != 1.0 || (local_754 != 1.0 || local_748 != 1.0))) |
                   (local_740 != 0.0 || (local_73c != 0.0 || local_538[0] != 0.0)) |
                   -((float)local_398.sizeof_hdr != 0.0) | -(local_518[0]._0_4_ != 0.0)) & 1,
             NIFTITEST_FALSE,(int *)&local_760);
  nifti_make_orthog_mat44(local_738,0.14,0.0,0.0,0.0,0.9,0.0,0.0,0.0,1.1);
  _PrintTest(0x27c,"nifti_make_orthog_mat44",
             (byte)((local_738[0].m[3][3] != 1.0 || local_738[0].m[2][2] != 1.0) |
                   -(local_738[0].m[1][1] != 1.0) | -(local_738[0].m[0][0] != 1.0)) & 1,
             NIFTITEST_FALSE,(int *)&local_760);
  nifti_swap_Nbytes(1,0x10,main::x);
  _PrintTest(0x287,"nifti_swap_16bytes",
             (uint)(main::x[0xf] != 'a' ||
                   ((main::x[0xe] != 'b' ||
                    (main::x[0xd] != 'c' || (main::x[0xc] != 'd' || main::x[0xb] != 'e'))) ||
                   ((main::x[10] != 'f' ||
                    (main::x[9] != 'g' || (main::x[8] != 'h' || main::x[7] != 'H'))) ||
                   ((main::x[6] != 'G' || (main::x[5] != 'F' || main::x[4] != 'E')) ||
                   ((main::x[3] != 'D' || main::x[2] != 'C') ||
                   (main::x[1] != 'B' || main::x[0] != 'A')))))),NIFTITEST_FALSE,(int *)&local_760);
  nifti_swap_Nbytes(1,8,main::x_1);
  _PrintTest(0x290,"nifti_swap_8bytes",
             (uint)(main::x_1[7] != 'a' ||
                   ((main::x_1[6] != 'b' || (main::x_1[5] != 'c' || main::x_1[4] != 'd')) ||
                   ((main::x_1[3] != 'D' || main::x_1[2] != 'C') ||
                   (main::x_1[1] != 'B' || main::x_1[0] != 'A')))),NIFTITEST_FALSE,(int *)&local_760
            );
  local_738[0].m[0]._0_8_ = nifti_simple_init_nim();
  _PrintTest(0x299,"nifti_simple_init_nim",
             (uint)((nifti_image *)local_738[0].m[0]._0_8_ == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_760);
  nifti_image_free((nifti_image *)local_738[0].m[0]._0_8_);
  local_738[0].m[0]._0_8_ = (nifti_image *)0x0;
  local_518[0] = nifti_image_open("ATestReferenceImageForReadingAndWriting.hdr","r",
                                  (nifti_image **)local_738);
  _PrintTest(0x2a1,"nifti_image_open",
             (uint)(local_518[0] == (znzFile)0x0 ||
                   (nifti_image *)local_738[0].m[0]._0_8_ == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_760);
  iVar1 = nifti_image_load((nifti_image *)local_738[0].m[0]._0_8_);
  _PrintTest(0x2a4,"nifti_image_load",(uint)(iVar1 == -1),NIFTITEST_FALSE,(int *)&local_760);
  nifti_image_unload((nifti_image *)local_738[0].m[0]._0_8_);
  _PrintTest(0x2a8,"nifti_image_unload",
             (uint)(*(void **)(local_738[0].m[0]._0_8_ + 0x298) != (void *)0x0),NIFTITEST_FALSE,
             (int *)&local_760);
  Xznzclose(local_518);
  nifti_image_free((nifti_image *)local_738[0].m[0]._0_8_);
  printf("\n\nTOTAL ERRORS=%d\n",(ulong)local_760);
  return local_760;
}

Assistant:

int main (int argc, char *argv[])
{
  char TEMP_STR[256];
  nifti_set_debug_level(3);
  int Errors=0;
  {
  PrintTest("NOT REALLY AN ERROR, JUST TESTING THE ERROR TEST REPORTING MECHANISM",1,NIFTITEST_FALSE,&Errors);
  PrintTest("NOT REALLY AN ERROR, JUST TESTING THE ERROR COUNTING MECHANISM",Errors==1,NIFTITEST_FALSE,&Errors);
  Errors=0;
  }
  {
  const char write_image_filename[6][64]={
    "ATestReferenceImageForReadingAndWriting.nii",
    "ATestReferenceImageForReadingAndWriting.hdr",
    "ATestReferenceImageForReadingAndWriting.img",
    "ATestReferenceImageForReadingAndWriting.nii.gz",
    "ATestReferenceImageForReadingAndWriting.hdr.gz",
    "ATestReferenceImageForReadingAndWriting.img.gz"
  };
  printf("======= Testing All Nifti Valid Names ======\n");
  fflush(stdout);
  unsigned int filenameindex;
  for(filenameindex=0;filenameindex<6; filenameindex++)
    {
    char buf[512];
    int CompressedTwoFile = strstr(write_image_filename[filenameindex],".img.gz") != 0 ||
      strstr(write_image_filename[filenameindex],".hdr.gz") != 0;

    printf("======= Testing with filename: %s ======\n",write_image_filename[filenameindex]);
    fflush(stdout);
    nifti_image * reference_image = generate_reference_image(write_image_filename[filenameindex],&Errors);
    /*
     * Add an extension to test extension reading
     */
    {
    static char ext[] = "THIS IS A TEST";
    sprintf(buf,"nifti_add_extension %s",write_image_filename[filenameindex]);
    PrintTest(buf,
              nifti_add_extension(reference_image,
                                  ext,sizeof(ext),
                                  NIFTI_ECODE_COMMENT) == -1,
              NIFTITEST_FALSE,&Errors);
    sprintf(buf,"valid_nifti_extension %s",write_image_filename[filenameindex]);
    PrintTest("valid_nifti_extensions",
              valid_nifti_extensions(reference_image) == 0,
              NIFTITEST_FALSE,&Errors);
    }
    PrintTest("Create reference image",reference_image==0,NIFTITEST_TRUE,&Errors);
    nifti_image_write   ( reference_image ) ;
    /*
     * test nifti_copy_extension
     */
    {
      nifti_image *nim = nifti_simple_init_nim();
      PrintTest("nifti_copy_extension",
                nifti_copy_extensions(nim,reference_image),
                NIFTITEST_FALSE,&Errors);

      nifti_image_free(nim);
      nim = nifti_copy_nim_info(reference_image);
      PrintTest("nifti_copy_nim_info",
                nim == 0,
                NIFTITEST_FALSE,&Errors);
      PrintTest("nifti_nim_is_valid",
                nifti_nim_is_valid(nim,0) == 0,
                NIFTITEST_FALSE,&Errors);


      nifti_image_free(nim);

    }
    {
    nifti_image * reloaded_image = nifti_image_read(reference_image->fname,1);
    PrintTest("Reload of image ",reloaded_image==0,NIFTITEST_TRUE,&Errors);

    {
    /*
     * if the file is named '.img', '.hdr', '.img.gz', or '.hdr.gz', then
     * the header extensions won't be saved with the file.
     * The test will fail if it finds an extension in a 2-file NIfTI, or
     * fails to find one in a '.nii' or '.nii.gz' file.
     */
    int result = valid_nifti_extensions(reloaded_image);
    sprintf(buf,"reload valid_nifti_extensions %s",write_image_filename[filenameindex]);
      PrintTest(buf,
                CompressedTwoFile ? result != 0 : result == 0,
                NIFTITEST_FALSE,&Errors);
    }
    nifti_image_infodump(reloaded_image);
    compare_reference_image_values(reference_image,reloaded_image,&Errors);
    nifti_image_free(reloaded_image);
    }

    {
    nifti_brick_list   NB_orig, NB_select;

    nifti_image      * nim_orig, * nim_select;

    int                blist[5] = { 7, 0, 5, 5, 9 };

    /*
     * test some error paths in the nifti_image_read_bricks
     */
    nim_orig = nifti_image_read_bricks(reference_image->fname,0,blist, &NB_orig);
    PrintTest("invalid arg bricked image read 1",nim_orig != 0,NIFTITEST_FALSE,&Errors);

    nim_orig   = nifti_image_read_bricks(reference_image->fname, 0, NULL,  &NB_orig);
    PrintTest("Reload of bricked image",nim_orig == 0,NIFTITEST_FALSE,&Errors);
    nifti_free_NBL(&NB_orig);
    nifti_image_free(nim_orig);

    nim_select = nifti_image_read_bricks(reference_image->fname, 5, blist, &NB_select);
    PrintTest("Reload of bricked image with blist",nim_orig == 0,NIFTITEST_FALSE,&Errors);
    nifti_free_NBL(&NB_select);
    nifti_image_free(nim_select);

    }
    /*
     * test nifti_update_dims_from_array
     */
    PrintTest("nifti_update_dims_from_array -- valid dims",
              nifti_update_dims_from_array(reference_image) != 0,
              NIFTITEST_FALSE,&Errors);
    reference_image->dim[0] = 8;
    PrintTest("nifti_update_dims_from_array -- invalid dims",
              nifti_update_dims_from_array(reference_image) == 0,
              NIFTITEST_FALSE,&Errors);
    {
    nifti_1_header x = nifti_convert_nim2nhdr(reference_image);
    char buf[512];
    sprintf(buf,"nifti_hdr_looks_good %s",reference_image->fname);
    PrintTest(buf,
              !nifti_hdr_looks_good(&x),
              NIFTITEST_FALSE,&Errors);
    }

    nifti_image_free(reference_image);
    }
  /*
   * check nifti_findimgname
   */
  {
  char *imgname = nifti_findimgname("ATestReferenceImageForReadingAndWriting.hdr",2);
  PrintTest("nifti_findimgname",
            imgname == 0 ||
            strcmp(imgname,"ATestReferenceImageForReadingAndWriting.img") != 0,
            NIFTITEST_FALSE,&Errors);
  free(imgname);
  }
  {
  int IsNiftiFile;
  IsNiftiFile = is_nifti_file(write_image_filename[0]);
  PrintTest("is_nifti_file0",
            IsNiftiFile != 1,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[1]);
  PrintTest("is_nifti_file1",
            IsNiftiFile != 2,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[3]);
  PrintTest("is_nifti_file2",
            IsNiftiFile != 1,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[4]);
  PrintTest("is_nifti_file2",
            IsNiftiFile != 2,NIFTITEST_FALSE,&Errors);
  }

  }
  {
  /*
   * test writing and reading an ascii file
   */
  nifti_image * reference_image =
    generate_reference_image("TestAsciiImage.nia",&Errors);
  reference_image->nifti_type = 3;
  nifti_image_write(reference_image);
  nifti_image * reloaded_image = nifti_image_read("TestAsciiImage.nia",1);
  PrintTest("Read/Write Ascii image",
            reloaded_image == 0,NIFTITEST_FALSE,&Errors);
  nifti_image_free(reference_image);
  nifti_image_free(reloaded_image);
  }

  {
  enum { NUM_FILE_NAMES=8 };
  const char * FILE_NAMES[NUM_FILE_NAMES]={
    "myimage",
    "myimage.tif",
    "myimage.tif.gz",
    "myimage.nii",
    "myimage.img.gz",
    ".nii",
    ".myhiddenimage",
    ".myhiddenimage.nii"
  };
  const char * KNOWN_FILE_BASENAMES[NUM_FILE_NAMES]={
    "myimage",
    "myimage.tif",
    "myimage.tif.gz",
    "myimage",
    "myimage",
    "",
    ".myhiddenimage",
    ".myhiddenimage"
  };
  const int KNOWN_nifti_validfilename[NUM_FILE_NAMES]={
    1,
    1,
    1,
    1,
    1,
    0,
    1,
    1
  };
  const int KNOWN_nifti_is_complete_filename[NUM_FILE_NAMES]={
    0,
    0,
    0,
    1,
    1,
    0,
    0,
    1
  };
  unsigned int fni;
  for(fni=0;fni<NUM_FILE_NAMES;fni++)
    {
    printf("\nTesting \"%s\" filename\n",FILE_NAMES[fni]);
    {
    int KnownValid=nifti_validfilename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_validfilename(\"%s\")=%d",FILE_NAMES[fni],KnownValid);
    PrintTest(TEMP_STR,KnownValid != KNOWN_nifti_validfilename[fni],NIFTITEST_FALSE,&Errors);
    }
    {
    int KnownValid=nifti_is_complete_filename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_is_complete_filename(\"%s\")=%d",FILE_NAMES[fni],KnownValid);
    PrintTest(TEMP_STR,KnownValid != KNOWN_nifti_is_complete_filename[fni],NIFTITEST_FALSE,&Errors);
    }

    {
    char * basename=nifti_makebasename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_makebasename(\"%s\")=\"%s\"",FILE_NAMES[fni],basename);
    PrintTest(TEMP_STR,strcmp(basename,KNOWN_FILE_BASENAMES[fni]) != 0,NIFTITEST_FALSE,&Errors);
    free(basename);

    }
    }
  /*
   * the following 2 calls aren't tested, because all they do is display
   * compile-time information -- no way to fail unless writing to stdout fails.
   */
  nifti_disp_lib_hist();
  nifti_disp_lib_version();
  /*
   * the following exercises error path code in nifti_image_read_bricks
   */
  PrintTest(
            "nifti_image_read_bricks 1",
            nifti_image_read_bricks((char *)0,-1,(const int *)0,(nifti_brick_list *)0) != 0,
            NIFTITEST_FALSE,
            &Errors);
  PrintTest(
            "nifti_image_read_bricks 1",
            nifti_image_read_bricks("NOFILE.NOFILE",-1,(const int *)0,(nifti_brick_list *)0) != 0,
            NIFTITEST_FALSE,
            &Errors);
  }
  /*
   * call nifti_datatype_string with all possible values
   */
#define nifti_datatype_test(constant,string)                            \
  {                                                                     \
  char buf[64];                                                         \
  sprintf(buf,"nifti_datatype_string %s",string);                       \
  PrintTest(                                                   \
            buf,                                                        \
            strcmp(nifti_datatype_string(constant),string) != 0,        \
            NIFTITEST_FALSE,                                            \
            &Errors);                                                   \
  }
  nifti_datatype_test(DT_UNKNOWN,"UNKNOWN");
  nifti_datatype_test(DT_BINARY, "BINARY");
  nifti_datatype_test(DT_INT8, "INT8");
  nifti_datatype_test(DT_UINT8, "UINT8");
  nifti_datatype_test(DT_INT16, "INT16");
  nifti_datatype_test(DT_UINT16, "UINT16");
  nifti_datatype_test(DT_INT32, "INT32");
  nifti_datatype_test(DT_UINT32, "UINT32");
  nifti_datatype_test(DT_INT64, "INT64");
  nifti_datatype_test(DT_UINT64, "UINT64");
  nifti_datatype_test(DT_FLOAT32, "FLOAT32");
  nifti_datatype_test(DT_FLOAT64, "FLOAT64");
  nifti_datatype_test(DT_FLOAT128, "FLOAT128");
  nifti_datatype_test(DT_COMPLEX64, "COMPLEX64");
  nifti_datatype_test(DT_COMPLEX128, "COMPLEX128");
  nifti_datatype_test(DT_COMPLEX256, "COMPLEX256");
  nifti_datatype_test(DT_RGB24, "RGB24");
#define nifti_is_inttype_test(constant,rval)            \
  {                                                     \
  char buf[64];                                         \
  sprintf(buf,"nifti_datatype_string %d",constant);     \
  PrintTest(                                   \
            buf,                                        \
            nifti_is_inttype(constant) != rval,         \
            NIFTITEST_FALSE,                            \
            &Errors);                                   \
  }
  nifti_is_inttype_test(DT_UNKNOWN,0);
  nifti_is_inttype_test(DT_BINARY,0);
  nifti_is_inttype_test(DT_INT8,1);
  nifti_is_inttype_test(DT_UINT8,1);
  nifti_is_inttype_test(DT_INT16,1);
  nifti_is_inttype_test(DT_UINT16,1);
  nifti_is_inttype_test(DT_INT32,1);
  nifti_is_inttype_test(DT_UINT32,1);
  nifti_is_inttype_test(DT_INT64,1);
  nifti_is_inttype_test(DT_UINT64,1);
  nifti_is_inttype_test(DT_FLOAT32,0);
  nifti_is_inttype_test(DT_FLOAT64,0);
  nifti_is_inttype_test(DT_FLOAT128,0);
  nifti_is_inttype_test(DT_COMPLEX64,0);
  nifti_is_inttype_test(DT_COMPLEX128,0);
  nifti_is_inttype_test(DT_COMPLEX256,0);
  nifti_is_inttype_test(DT_RGB24,1);
#define nifti_units_string_test(constant,string)                \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_units_string_test %s",string);             \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_units_string(constant),string) != 0,   \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_units_string_test(NIFTI_UNITS_METER,"m");
  nifti_units_string_test(NIFTI_UNITS_MM,"mm");
  nifti_units_string_test(NIFTI_UNITS_MICRON,"um");
  nifti_units_string_test(NIFTI_UNITS_SEC,"s");
  nifti_units_string_test(NIFTI_UNITS_MSEC,"ms");
  nifti_units_string_test(NIFTI_UNITS_USEC,"us");
  nifti_units_string_test(NIFTI_UNITS_HZ,"Hz");
  nifti_units_string_test(NIFTI_UNITS_PPM,"ppm");
  nifti_units_string_test(NIFTI_UNITS_RADS,"rad/s");
#define nifti_intent_string_test(constant,string)               \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_intent_string %s",string);                 \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_intent_string(constant),string) != 0,  \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_intent_string_test(NIFTI_INTENT_CORREL,"Correlation statistic");
  nifti_intent_string_test(NIFTI_INTENT_TTEST,"T-statistic");
  nifti_intent_string_test(NIFTI_INTENT_FTEST,"F-statistic");
  nifti_intent_string_test(NIFTI_INTENT_ZSCORE,"Z-score");
  nifti_intent_string_test(NIFTI_INTENT_CHISQ,"Chi-squared distribution");
  nifti_intent_string_test(NIFTI_INTENT_BETA,"Beta distribution");
  nifti_intent_string_test(NIFTI_INTENT_BINOM,"Binomial distribution");
  nifti_intent_string_test(NIFTI_INTENT_GAMMA,"Gamma distribution");
  nifti_intent_string_test(NIFTI_INTENT_POISSON,"Poisson distribution");
  nifti_intent_string_test(NIFTI_INTENT_NORMAL,"Normal distribution");
  nifti_intent_string_test(NIFTI_INTENT_FTEST_NONC,"F-statistic noncentral");
  nifti_intent_string_test(NIFTI_INTENT_CHISQ_NONC,"Chi-squared noncentral");
  nifti_intent_string_test(NIFTI_INTENT_LOGISTIC,"Logistic distribution");
  nifti_intent_string_test(NIFTI_INTENT_LAPLACE,"Laplace distribution");
  nifti_intent_string_test(NIFTI_INTENT_UNIFORM,"Uniform distribition");
  nifti_intent_string_test(NIFTI_INTENT_TTEST_NONC,"T-statistic noncentral");
  nifti_intent_string_test(NIFTI_INTENT_WEIBULL,"Weibull distribution");
  nifti_intent_string_test(NIFTI_INTENT_CHI,"Chi distribution");
  nifti_intent_string_test(NIFTI_INTENT_INVGAUSS,"Inverse Gaussian distribution");
  nifti_intent_string_test(NIFTI_INTENT_EXTVAL,"Extreme Value distribution");
  nifti_intent_string_test(NIFTI_INTENT_PVAL,"P-value");
  nifti_intent_string_test(NIFTI_INTENT_LOGPVAL,"Log P-value");
  nifti_intent_string_test(NIFTI_INTENT_LOG10PVAL,"Log10 P-value");
  nifti_intent_string_test(NIFTI_INTENT_ESTIMATE,"Estimate");
  nifti_intent_string_test(NIFTI_INTENT_LABEL,"Label index");
  nifti_intent_string_test(NIFTI_INTENT_NEURONAME,"NeuroNames index");
  nifti_intent_string_test(NIFTI_INTENT_GENMATRIX,"General matrix");
  nifti_intent_string_test(NIFTI_INTENT_SYMMATRIX,"Symmetric matrix");
  nifti_intent_string_test(NIFTI_INTENT_DISPVECT,"Displacement vector");
  nifti_intent_string_test(NIFTI_INTENT_VECTOR,"Vector");
  nifti_intent_string_test(NIFTI_INTENT_POINTSET,"Pointset");
  nifti_intent_string_test(NIFTI_INTENT_TRIANGLE,"Triangle");
  nifti_intent_string_test(NIFTI_INTENT_QUATERNION,"Quaternion");
  nifti_intent_string_test(NIFTI_INTENT_DIMLESS,"Dimensionless number");
  nifti_intent_string_test(-200,"Unknown");

#define nifti_slice_string_test(constant,string)                \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_slice_string_test %s",string);             \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_slice_string(constant),string) != 0,   \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_slice_string_test(NIFTI_SLICE_SEQ_INC,"sequential_increasing");
  nifti_slice_string_test(NIFTI_SLICE_SEQ_DEC,"sequential_decreasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_INC,"alternating_increasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_DEC,"alternating_decreasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_INC2,"alternating_increasing_2");
  nifti_slice_string_test(NIFTI_SLICE_ALT_DEC2,"alternating_decreasing_2");
#define nifti_orientation_string_test(constant,string)                  \
  {                                                                     \
  char buf[64];                                                         \
  sprintf(buf,"nifti_orientation_string_test %s",string);               \
  PrintTest(                                                   \
            buf,                                                        \
            strcmp(nifti_orientation_string(constant),string) != 0,     \
            NIFTITEST_FALSE,                                            \
            &Errors);                                                   \
  }
  nifti_orientation_string_test(NIFTI_L2R,"Left-to-Right");
  nifti_orientation_string_test(NIFTI_R2L,"Right-to-Left");
  nifti_orientation_string_test(NIFTI_P2A,"Posterior-to-Anterior");
  nifti_orientation_string_test(NIFTI_A2P,"Anterior-to-Posterior");
  nifti_orientation_string_test(NIFTI_I2S,"Inferior-to-Superior");
  nifti_orientation_string_test(NIFTI_S2I,"Superior-to-Inferior");

#define nifti_datatype_sizes_test(constant,Nbyper,Swapsize)     \
  {                                                             \
  int nbyper;                                                   \
  int swapsize;                                                 \
  char buf[64];                                                 \
  sprintf(buf,"nifti_datatype_sizes_test %d",constant);         \
  nifti_datatype_sizes(constant,&nbyper,&swapsize);             \
  PrintTest(                                           \
            buf,                                                \
            nbyper != Nbyper || swapsize != Swapsize,           \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }

  nifti_datatype_sizes_test(DT_UINT8,1,0);
  nifti_datatype_sizes_test(DT_UINT16,2,2);
  nifti_datatype_sizes_test(DT_RGB24,3,0);
  nifti_datatype_sizes_test(DT_FLOAT32,4,4);
  nifti_datatype_sizes_test(DT_COMPLEX64,8,4);
  nifti_datatype_sizes_test(DT_UINT64,8,8);
  nifti_datatype_sizes_test(DT_FLOAT128,16,16);
  nifti_datatype_sizes_test(DT_COMPLEX128,16,8);
  nifti_datatype_sizes_test(DT_COMPLEX256,32,16);

  {
  mat44 R;
  unsigned i,j;
  for(i = 0; i < 4; i++)
    for(j = 0; j < 4; j++)
      R.m[i][j] = (i == j ? 1 : 0);
  float qb;
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  float dx;
  float dy;
  float dz;
  float qfac;
  nifti_mat44_to_quatern(R,&qb,&qc,&qd,&qx,&qy,&qz,&dx,&dy,&dz,&qfac);
  PrintTest("nifti_mat44_to_quatern",
            qb != 0.000000 || qc != 0.000000 || qd != 0.000000 ||
            qx != 0.000000 || qy != 0.000000 || qd != 0.000000 ||
            dx != 1.000000 || dy != 1.000000 || dz != 1.000000 ||
            qfac != 1.000000,
            NIFTITEST_FALSE,&Errors);
  }
  {
  mat44 x = nifti_make_orthog_mat44(0.14,0.0,0.0,
                                    0.0,0.9,0.0,
                                    0.0,0.0,1.1);

  PrintTest("nifti_make_orthog_mat44",
            x.m[0][0] != 1.0 || x.m[1][1] != 1.0 ||
            x.m[2][2] != 1.0 || x.m[3][3] != 1.0,
            NIFTITEST_FALSE,&Errors);
  }
  {
  static char x[16] = { 'a','b','c','d','e','f','g','h',
                        'H','G','F','E','D','C','B','A' };
  nifti_swap_Nbytes(1,16,(void *)x);
  PrintTest("nifti_swap_16bytes",
            x[0] != 'A' || x[1] != 'B' || x[2] != 'C' || x[3] != 'D' ||
            x[4] != 'E' || x[5] != 'F' || x[6] != 'G' || x[7] != 'H' ||
            x[8] != 'h' || x[9] != 'g' || x[10] != 'f' || x[11] != 'e' ||
            x[12] != 'd' || x[13] != 'c' || x[14] != 'b' || x[15] != 'a',
            NIFTITEST_FALSE,&Errors);

  }
  {
  static char x[8] = { 'a','b','c','d','D','C','B','A' };
  nifti_swap_Nbytes(1,8,(void *)x);
  PrintTest("nifti_swap_8bytes",
            x[0] != 'A' || x[1] != 'B' || x[2] != 'C' || x[3] != 'D' ||
            x[4] != 'd' || x[5] != 'c' || x[6] != 'b' || x[7] != 'a',
            NIFTITEST_FALSE,&Errors);

  }
  {
  /*
   * test nifti_simple_init_nim
   */
  nifti_image *nim = nifti_simple_init_nim();
  PrintTest("nifti_simple_init_nim",
            nim == 0,NIFTITEST_FALSE,&Errors);
  nifti_image_free(nim); nim = 0;
  /*
   * test nifti_image_open
   */
  znzFile f = nifti_image_open("ATestReferenceImageForReadingAndWriting.hdr","r",&nim);
  PrintTest("nifti_image_open",
            nim == 0 || f == 0,
            NIFTITEST_FALSE,&Errors);
  PrintTest("nifti_image_load",
            nifti_image_load(nim) == -1,
            NIFTITEST_FALSE,&Errors);
  nifti_image_unload(nim);
  PrintTest("nifti_image_unload",
            nim->data != 0,
            NIFTITEST_FALSE,&Errors);

  znzclose(f);
  nifti_image_free(nim);
  }
  /*
   * call various functions from nifti_stats
   */
  printf("\n\nTOTAL ERRORS=%d\n",Errors);
  return Errors;
}